

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O0

bool CyclicKeyTest<Blob<128>>(pfHash hash,int cycleLen,int cycleReps,int keycount,bool drawDiagram)

{
  code *pcVar1;
  byte bVar2;
  int iVar3;
  uint32_t uVar4;
  uint32_t *puVar5;
  void *pvVar6;
  reference pvVar7;
  uint in_ECX;
  uint in_EDX;
  uint in_ESI;
  code *in_RDI;
  ulong uVar8;
  byte in_R8B;
  bool in_stack_0000003b;
  bool in_stack_0000003c;
  bool in_stack_0000003d;
  bool in_stack_0000003e;
  bool in_stack_0000003f;
  vector<Blob<128>,_std::allocator<Blob<128>_>_> *in_stack_00000040;
  bool result;
  int j;
  int i;
  uint8_t *key;
  uint8_t *cycle;
  int keyLen;
  vector<Blob<128>,_std::allocator<Blob<128>_>_> hashes;
  Rand r;
  uint32_t in_stack_ffffffffffffff3c;
  Rand *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  undefined4 uVar9;
  void *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  int local_68;
  uint local_64;
  vector<Blob<128>,_std::allocator<Blob<128>_>_> local_40;
  byte local_15;
  uint local_14;
  uint local_10;
  uint local_c;
  code *local_8;
  
  local_15 = in_R8B & 1;
  local_14 = in_ECX;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  printf("Keyset \'Cyclic\' - %d cycles of %d bytes - %d keys\n",(ulong)in_EDX,(ulong)in_ESI,
         (ulong)in_ECX);
  Rand::Rand(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
  std::vector<Blob<128>,_std::allocator<Blob<128>_>_>::vector
            ((vector<Blob<128>,_std::allocator<Blob<128>_>_> *)0x15e2e7);
  std::vector<Blob<128>,_std::allocator<Blob<128>_>_>::resize
            ((vector<Blob<128>,_std::allocator<Blob<128>_>_> *)
             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
             (size_type)in_stack_ffffffffffffff58);
  iVar3 = local_c * local_10;
  uVar8 = (ulong)(int)(local_c + 0x10);
  if ((long)uVar8 < 0) {
    uVar8 = 0xffffffffffffffff;
  }
  puVar5 = (uint32_t *)operator_new__(uVar8);
  uVar8 = (ulong)iVar3;
  if ((long)uVar8 < 0) {
    uVar8 = 0xffffffffffffffff;
  }
  pvVar6 = operator_new__(uVar8);
  for (local_64 = 0; (int)local_64 < (int)local_14; local_64 = local_64 + 1) {
    Rand::rand_p((Rand *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                 in_stack_ffffffffffffff58,in_stack_ffffffffffffff54);
    uVar4 = f3mix(local_64 ^ 0x746a94f1);
    pcVar1 = local_8;
    *puVar5 = uVar4;
    for (local_68 = 0; local_68 < iVar3; local_68 = local_68 + 1) {
      *(undefined1 *)((long)pvVar6 + (long)local_68) =
           *(undefined1 *)((long)puVar5 + (long)(local_68 % (int)local_c));
    }
    in_stack_ffffffffffffff58 = pvVar6;
    in_stack_ffffffffffffff64 = iVar3;
    pvVar7 = std::vector<Blob<128>,_std::allocator<Blob<128>_>_>::operator[]
                       (&local_40,(long)(int)local_64);
    (*pcVar1)(in_stack_ffffffffffffff58,in_stack_ffffffffffffff64,0,pvVar7);
  }
  bVar2 = TestHashList<Blob<128>>
                    (in_stack_00000040,in_stack_0000003f,in_stack_0000003e,in_stack_0000003d,
                     in_stack_0000003c,in_stack_0000003b);
  uVar9 = CONCAT13(bVar2,(int3)in_stack_ffffffffffffff54);
  printf("\n");
  if (puVar5 != (uint32_t *)0x0) {
    operator_delete__(puVar5);
  }
  if (pvVar6 != (void *)0x0) {
    operator_delete__(pvVar6);
  }
  std::vector<Blob<128>,_std::allocator<Blob<128>_>_>::~vector
            ((vector<Blob<128>,_std::allocator<Blob<128>_>_> *)
             CONCAT44(uVar9,in_stack_ffffffffffffff50));
  return (bool)(bVar2 & 1);
}

Assistant:

bool CyclicKeyTest ( pfHash hash, int cycleLen, int cycleReps, const int keycount, bool drawDiagram )
{
  printf("Keyset 'Cyclic' - %d cycles of %d bytes - %d keys\n",cycleReps,cycleLen,keycount);

  Rand r(483723);

  std::vector<hashtype> hashes;
  hashes.resize(keycount);

  int keyLen = cycleLen * cycleReps;

  uint8_t * cycle = new uint8_t[cycleLen + 16];
  uint8_t * key = new uint8_t[keyLen];

  //----------

  for(int i = 0; i < keycount; i++)
  {
    r.rand_p(cycle,cycleLen);

    *(uint32_t*)cycle = f3mix(i ^ 0x746a94f1);

    for(int j = 0; j < keyLen; j++)
    {
      key[j] = cycle[j % cycleLen];
    }

    hash(key,keyLen,0,&hashes[i]);
  }

  //----------

  bool result = true;

  result &= TestHashList(hashes,drawDiagram);
  printf("\n");

  delete [] cycle;
  delete [] key;

  return result;
}